

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_instance_iterator.h
# Opt level: O0

void __thiscall Am_Instance_Iterator::~Am_Instance_Iterator(Am_Instance_Iterator *this)

{
  Am_Instance_Iterator *this_local;
  
  Am_Object::~Am_Object(&this->prototype);
  Am_Object::~Am_Object(&this->current);
  return;
}

Assistant:

class _OA_DL_CLASSIMPORT Am_Instance_Iterator
{
public:
  Am_Instance_Iterator();
  Am_Instance_Iterator(Am_Object object);

  Am_Instance_Iterator &operator=(Am_Object &object);

  unsigned short Length(); // Number of instances in the list.
  void Start();            // Begin list at the start.
  void Next();             // Move to next element in list.
  bool Last();             // Is this the last element?
  Am_Object Get();         // Get the current element.
private:
  Am_Object current;
  Am_Object prototype;
}